

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Matchers::StdString::ContainsMatcher::ContainsMatcher
          (ContainsMatcher *this,CasedString *comparator)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"contains",&local_39);
  StringMatcherBase::StringMatcherBase(&this->super_StringMatcherBase,&local_38,comparator);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_StringMatcherBase).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_002297a8;
  (this->super_StringMatcherBase).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_002297d8;
  return;
}

Assistant:

ContainsMatcher::ContainsMatcher( CasedString const& comparator ) : StringMatcherBase( "contains", comparator ) {}